

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc stbi__skip_jpeg_junk_at_end(stbi__jpeg *j)

{
  int iVar1;
  stbi_uc local_19;
  stbi_uc x;
  stbi__jpeg *j_local;
  
  do {
    iVar1 = stbi__at_eof(j->s);
    if (iVar1 != 0) {
      return 0xff;
    }
    local_19 = stbi__get8(j->s);
    while (local_19 == 0xff) {
      iVar1 = stbi__at_eof(j->s);
      if (iVar1 != 0) {
        return 0xff;
      }
      local_19 = stbi__get8(j->s);
      if ((local_19 != '\0') && (local_19 != 0xff)) {
        return local_19;
      }
    }
  } while( true );
}

Assistant:

static stbi_uc stbi__skip_jpeg_junk_at_end(stbi__jpeg *j)
{
   // some JPEGs have junk at end, skip over it but if we find what looks
   // like a valid marker, resume there
   while (!stbi__at_eof(j->s)) {
      stbi_uc x = stbi__get8(j->s);
      while (x == 0xff) { // might be a marker
         if (stbi__at_eof(j->s)) return STBI__MARKER_none;
         x = stbi__get8(j->s);
         if (x != 0x00 && x != 0xff) {
            // not a stuffed zero or lead-in to another marker, looks
            // like an actual marker, return it
            return x;
         }
         // stuffed zero has x=0 now which ends the loop, meaning we go
         // back to regular scan loop.
         // repeated 0xff keeps trying to read the next byte of the marker.
      }
   }
   return STBI__MARKER_none;
}